

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.cc
# Opt level: O2

size_t __thiscall
CoreML::Specification::SupportVectorClassifier::ByteSizeLong(SupportVectorClassifier *this)

{
  long lVar1;
  uint uVar2;
  size_t sVar3;
  size_t sVar4;
  Type *value;
  ulong uVar5;
  int iVar6;
  long lVar7;
  uint i;
  uint index;
  int value_00;
  
  sVar3 = google::protobuf::internal::WireFormatLite::Int32Size
                    (&this->numberofsupportvectorsperclass_);
  index = 0;
  if (sVar3 == 0) {
    iVar6 = 0;
    lVar7 = 0;
  }
  else {
    iVar6 = (int)sVar3;
    sVar4 = google::protobuf::io::CodedOutputStream::VarintSize32SignExtended(iVar6);
    lVar7 = sVar4 + 1;
  }
  this->_numberofsupportvectorsperclass_cached_byte_size_ = iVar6;
  uVar2 = (this->coefficients_).super_RepeatedPtrFieldBase.current_size_;
  lVar7 = lVar7 + sVar3 + (ulong)uVar2;
  for (; uVar2 != index; index = index + 1) {
    value = google::protobuf::internal::RepeatedPtrFieldBase::
            Get<google::protobuf::RepeatedPtrField<CoreML::Specification::Coefficients>::TypeHandler>
                      (&(this->coefficients_).super_RepeatedPtrFieldBase,index);
    sVar3 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::Coefficients>(value);
    lVar7 = lVar7 + sVar3;
  }
  uVar5 = (ulong)(uint)(this->rho_).current_size_;
  lVar1 = uVar5 * 8;
  iVar6 = 0;
  if (uVar5 == 0) {
    value_00 = 0;
  }
  else {
    value_00 = (int)lVar1;
    sVar3 = google::protobuf::io::CodedOutputStream::VarintSize32SignExtended(value_00);
    lVar7 = lVar7 + sVar3 + 1;
  }
  this->_rho_cached_byte_size_ = value_00;
  lVar7 = lVar7 + lVar1;
  uVar5 = (ulong)(uint)(this->proba_).current_size_;
  lVar1 = uVar5 * 8;
  if (uVar5 != 0) {
    iVar6 = (int)lVar1;
    sVar3 = google::protobuf::io::CodedOutputStream::VarintSize32SignExtended(iVar6);
    lVar7 = lVar7 + sVar3 + 1;
  }
  this->_proba_cached_byte_size_ = iVar6;
  lVar7 = lVar7 + lVar1;
  uVar5 = (ulong)(uint)(this->probb_).current_size_;
  lVar1 = uVar5 * 8;
  if (uVar5 == 0) {
    iVar6 = 0;
  }
  else {
    iVar6 = (int)lVar1;
    sVar3 = google::protobuf::io::CodedOutputStream::VarintSize32SignExtended(iVar6);
    lVar7 = lVar7 + sVar3 + 1;
  }
  this->_probb_cached_byte_size_ = iVar6;
  sVar3 = lVar7 + lVar1;
  if (this->kernel_ != (Kernel *)0x0 &&
      this != (SupportVectorClassifier *)&_SupportVectorClassifier_default_instance_) {
    sVar4 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::Kernel>(this->kernel_);
    sVar3 = sVar3 + sVar4 + 1;
  }
  if (this->_oneof_case_[0] == 4) {
    sVar4 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::DenseSupportVectors>
                      ((this->supportVectors_).densesupportvectors_);
LAB_00549dca:
    sVar3 = sVar3 + sVar4 + 1;
  }
  else if (this->_oneof_case_[0] == 3) {
    sVar4 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::SparseSupportVectors>
                      ((this->supportVectors_).sparsesupportvectors_);
    goto LAB_00549dca;
  }
  if (this->_oneof_case_[1] == 0x65) {
    sVar4 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::Int64Vector>
                      ((this->ClassLabels_).int64classlabels_);
  }
  else {
    if (this->_oneof_case_[1] != 100) goto LAB_00549e01;
    sVar4 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::StringVector>
                      ((this->ClassLabels_).stringclasslabels_);
  }
  sVar3 = sVar3 + sVar4 + 2;
LAB_00549e01:
  this->_cached_size_ = (int)sVar3;
  return sVar3;
}

Assistant:

size_t SupportVectorClassifier::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.SupportVectorClassifier)
  size_t total_size = 0;

  // repeated int32 numberOfSupportVectorsPerClass = 2;
  {
    size_t data_size = ::google::protobuf::internal::WireFormatLite::
      Int32Size(this->numberofsupportvectorsperclass_);
    if (data_size > 0) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _numberofsupportvectorsperclass_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  // repeated .CoreML.Specification.Coefficients coefficients = 5;
  {
    unsigned int count = this->coefficients_size();
    total_size += 1UL * count;
    for (unsigned int i = 0; i < count; i++) {
      total_size +=
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->coefficients(i));
    }
  }

  // repeated double rho = 6;
  {
    unsigned int count = this->rho_size();
    size_t data_size = 8UL * count;
    if (data_size > 0) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _rho_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  // repeated double probA = 7;
  {
    unsigned int count = this->proba_size();
    size_t data_size = 8UL * count;
    if (data_size > 0) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _proba_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  // repeated double probB = 8;
  {
    unsigned int count = this->probb_size();
    size_t data_size = 8UL * count;
    if (data_size > 0) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _probb_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  // .CoreML.Specification.Kernel kernel = 1;
  if (this->has_kernel()) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->kernel_);
  }

  switch (supportVectors_case()) {
    // .CoreML.Specification.SparseSupportVectors sparseSupportVectors = 3;
    case kSparseSupportVectors: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *supportVectors_.sparsesupportvectors_);
      break;
    }
    // .CoreML.Specification.DenseSupportVectors denseSupportVectors = 4;
    case kDenseSupportVectors: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *supportVectors_.densesupportvectors_);
      break;
    }
    case SUPPORTVECTORS_NOT_SET: {
      break;
    }
  }
  switch (ClassLabels_case()) {
    // .CoreML.Specification.StringVector stringClassLabels = 100;
    case kStringClassLabels: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *ClassLabels_.stringclasslabels_);
      break;
    }
    // .CoreML.Specification.Int64Vector int64ClassLabels = 101;
    case kInt64ClassLabels: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *ClassLabels_.int64classlabels_);
      break;
    }
    case CLASSLABELS_NOT_SET: {
      break;
    }
  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}